

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void framebuffer_size_callback(GLFWwindow *window,int width,int height)

{
  glViewport(0,0,width,height);
  glMatrixMode(0x1701);
  glLoadMatrixf();
  return;
}

Assistant:

void framebuffer_size_callback(GLFWwindow* window, int width, int height)
{
    float ratio = 1.f;
    mat4x4 projection;

    if (height > 0)
        ratio = (float) width / (float) height;

    // Setup viewport
    glViewport(0, 0, width, height);

    // Change to the projection matrix and set our viewing volume
    glMatrixMode(GL_PROJECTION);
    mat4x4_perspective(projection,
                       60.f * (float) M_PI / 180.f,
                       ratio,
                       1.f, 1024.f);
    glLoadMatrixf((const GLfloat*) projection);
}